

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O0

string * __thiscall
license::FullLicenseInfo::printForSign_abi_cxx11_
          (string *__return_storage_ptr__,FullLicenseInfo *this)

{
  ostream *poVar1;
  long lVar2;
  string local_200;
  string local_1d0;
  string local_1b0;
  ostringstream local_190 [8];
  ostringstream oss;
  FullLicenseInfo *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  trim_copy(&local_1d0,&this->product);
  toupper_copy(&local_1b0,&local_1d0);
  std::operator<<((ostream *)local_190,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::ostream::operator<<(local_190,0x17f);
  if ((this->has_client_sig & 1U) != 0) {
    trim_copy(&local_200,&this->client_signature);
    std::operator<<((ostream *)local_190,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  if ((this->has_versions & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)local_190,"|");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->from_sw_version);
    poVar1 = std::operator<<(poVar1,"-");
    std::ostream::operator<<(poVar1,this->to_sw_version);
  }
  if ((this->has_expiry & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)local_190,"|");
    poVar1 = std::operator<<(poVar1,(string *)&this->from_date);
    poVar1 = std::operator<<(poVar1,"|");
    std::operator<<(poVar1,(string *)&this->to_date);
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    poVar1 = std::operator<<((ostream *)local_190,"|");
    std::operator<<(poVar1,(string *)&this->extra_data);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

string FullLicenseInfo::printForSign() const {
	ostringstream oss;
	oss << toupper_copy(trim_copy(this->product));
	oss << SHARED_RANDOM
	;
	if (has_client_sig) {
		oss << trim_copy(this->client_signature);
	}
	if (has_versions) {
		oss << "|" << this->from_sw_version << "-" << this->to_sw_version;
	}
	if (has_expiry) {
		oss << "|" << this->from_date << "|" << this->to_date;
	}
	if (this->extra_data.length() > 0) {
		oss << "|" << extra_data;
	}
#ifdef _DEBUG
	cout << "[" << oss.str() << "]" << endl;
#endif
	return oss.str();

}